

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O1

void __thiscall XmlOutput::closeTag(XmlOutput *this)

{
  XMLState XVar1;
  int *piVar2;
  QTextStream *pQVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QString local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  XVar1 = this->currentState;
  if (XVar1 == Attribute) {
    QTextStream::operator<<(this->xmlFile," />");
    QList<QString>::pop_back(&(this->tagStack).super_QList<QString>);
    this->currentState = Tag;
    if (this->currentLevel != 0) {
      this->currentLevel = this->currentLevel + -1;
    }
    updateIndent(this);
    if (this->currentLevel == 0) {
      this->currentState = Bare;
    }
  }
  else if (XVar1 == Tag) {
    if (this->currentLevel != 0) {
      this->currentLevel = this->currentLevel + -1;
    }
    updateIndent(this);
    if (this->currentLevel == 0) {
      this->currentState = Bare;
    }
    if (this->format == NewLine) {
      pQVar3 = (QTextStream *)Qt::endl(this->xmlFile);
      QTextStream::operator<<(pQVar3,(QString *)&this->currentIndent);
    }
    pQVar3 = (QTextStream *)QTextStream::operator<<(this->xmlFile,"</");
    iVar4 = QList<QString>::end(&(this->tagStack).super_QList<QString>);
    doConversion(&local_48,this,iVar4.i + -1);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_48);
    QTextStream::operator<<(pQVar3,'>');
    piVar2 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),2,0x10)
        ;
      }
    }
    QList<QString>::pop_back(&(this->tagStack).super_QList<QString>);
  }
  else if (XVar1 == Bare) {
    if ((this->tagStack).super_QList<QString>.d.size == 0) {
      local_48.d.d._0_4_ = 2;
      local_48.d.d._4_4_ = 0;
      local_48.d.ptr._0_4_ = 0;
      local_48.d._12_8_ = 0;
      local_48.d.size._4_4_ = 0;
      local_30 = "default";
      QMessageLogger::debug((char *)&local_48,"<Root>: Cannot close tag, no tags on stack");
    }
    else {
      local_48.d.d._0_4_ = 2;
      local_48.d.d._4_4_ = 0;
      local_48.d.ptr._0_4_ = 0;
      local_48.d._12_8_ = 0;
      local_48.d.size._4_4_ = 0;
      local_30 = "default";
      QMessageLogger::debug
                ((char *)&local_48,"<Root>: Cannot close tag in Bare state, %d tags on stack");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::closeTag()
{
    switch(currentState) {
        case Bare:
            if (tagStack.size())
                //warn_msg(WarnLogic, "<Root>: Cannot close tag in Bare state, %d tags on stack", tagStack.count());
                qDebug("<Root>: Cannot close tag in Bare state, %d tags on stack", int(tagStack.size()));
            else
                //warn_msg(WarnLogic, "<Root>: Cannot close tag, no tags on stack");
                qDebug("<Root>: Cannot close tag, no tags on stack");
            return;
        case Tag:
            decreaseIndent(); // <--- Pre-decrease indent
            if (format == NewLine)
                xmlFile << Qt::endl << currentIndent;
            xmlFile << "</" << doConversion(tagStack.last()) << '>';
            tagStack.pop_back();
            break;
        case Attribute:
            xmlFile << " />";
            tagStack.pop_back();
            currentState = Tag;
            decreaseIndent(); // <--- Post-decrease indent
            break;
    }
}